

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O1

float rsg::BlockStatement::getWeight(GeneratorState *state)

{
  int iVar1;
  Statement *pSVar2;
  long lVar3;
  float fVar4;
  
  iVar1 = (int)((ulong)((long)(state->m_statementStack->
                              super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(state->m_statementStack->
                             super__Vector_base<rsg::Statement_*,_std::allocator<rsg::Statement_*>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3);
  fVar4 = 0.0;
  if (iVar1 + 1 < state->m_shaderParams->maxStatementDepth) {
    pSVar2 = GeneratorState::getStatementStackEntry(state,iVar1 + -1);
    if (pSVar2 == (Statement *)0x0) {
      fVar4 = 1.0;
    }
    else {
      lVar3 = __dynamic_cast(pSVar2,&Statement::typeinfo,&typeinfo,0);
      fVar4 = *(float *)(&DAT_0069db4c + (ulong)(lVar3 == 0) * 4);
    }
  }
  return fVar4;
}

Assistant:

float BlockStatement::getWeight (const GeneratorState& state)
{
	if (state.getStatementDepth()+1 < state.getShaderParameters().maxStatementDepth)
	{
		if (isCurrentTopStatementBlock(state))
			return 0.2f; // Low probability for anonymous blocks.
		else
			return 1.0f;
	}
	else
		return 0.0f;
}